

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bad_identifiers_proto2.pb.cc
# Opt level: O0

Message * __thiscall
proto2_unittest::TestConflictingMethodNames::GetResponsePrototype
          (TestConflictingMethodNames *this,MethodDescriptor *method)

{
  ServiceDescriptor **v1;
  ServiceDescriptor **v2;
  char *pcVar1;
  LogMessage *pLVar2;
  DummyMessage *pDVar3;
  int __c;
  LogMessage local_68;
  Voidify local_55 [13];
  LogMessage local_48;
  Voidify local_31;
  ServiceDescriptor *local_30;
  ServiceDescriptor *local_28;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  MethodDescriptor *method_local;
  TestConflictingMethodNames *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)method;
  method_local = (MethodDescriptor *)this;
  local_28 = google::protobuf::MethodDescriptor::service(method);
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::ServiceDescriptor_const*>(&local_28);
  local_30 = descriptor();
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::ServiceDescriptor_const*>(&local_30);
  local_20 = absl::lts_20250127::log_internal::
             Check_EQImpl<google::protobuf::ServiceDescriptor_const*,google::protobuf::ServiceDescriptor_const*>
                       (v1,v2,"method->service() == descriptor()");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/compiler/cpp/test_bad_identifiers_proto2.pb.cc"
               ,0x23bb,pcVar1);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_48);
  }
  pcVar1 = google::protobuf::MethodDescriptor::index
                     ((MethodDescriptor *)absl_log_internal_check_op_result,(char *)v2,__c);
  if ((int)pcVar1 == 0) {
    pDVar3 = DummyMessage::default_instance();
    return (Message *)pDVar3;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/compiler/cpp/test_bad_identifiers_proto2.pb.cc"
             ,0x23c1);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [44])"Bad method index; this should never happen.");
  absl::lts_20250127::log_internal::Voidify::operator&&(local_55,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_68);
}

Assistant:

const ::google::protobuf::Message& TestConflictingMethodNames::GetResponsePrototype(
    const ::google::protobuf::MethodDescriptor* PROTOBUF_NONNULL method) const {
  ABSL_DCHECK_EQ(method->service(), descriptor());
  switch (method->index()) {
    case 0:
      return ::proto2_unittest::DummyMessage::default_instance();

    default:
      ABSL_LOG(FATAL) << "Bad method index; this should never happen.";
      return *::google::protobuf::MessageFactory::generated_factory()->GetPrototype(
          method->output_type());
  }
}